

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O1

HighsStatus __thiscall Highs::getInfoValue(Highs *this,string *info,int64_t *value)

{
  InfoStatus IVar1;
  
  IVar1 = getLocalInfoValue(&(this->options_).super_HighsOptionsStruct.log_options,info,
                            (this->info_).super_HighsInfoStruct.valid,&(this->info_).records,value);
  if (IVar1 != kOk) {
    IVar1 = (uint)(IVar1 == kUnavailable) * 2 - kUnknownInfo;
  }
  return IVar1;
}

Assistant:

HighsStatus Highs::getInfoValue(const std::string& info, int64_t& value) const {
  InfoStatus status = getLocalInfoValue(options_.log_options, info, info_.valid,
                                        info_.records, value);
  if (status == InfoStatus::kOk) {
    return HighsStatus::kOk;
  } else if (status == InfoStatus::kUnavailable) {
    return HighsStatus::kWarning;
  } else {
    return HighsStatus::kError;
  }
}